

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.cpp
# Opt level: O0

void __thiscall AGSSock::Pool::clear(Pool *this)

{
  __sighandler_t __handler;
  int __sig;
  Lock local_18;
  Lock lock;
  Pool *this_local;
  Mutex *mutex;
  
  mutex = &this->guard_;
  lock.mutex_ = (Mutex *)this;
  AGSSockAPI::Mutex::Lock::Lock(&local_18,mutex);
  __sig = (int)mutex;
  std::
  unordered_set<AGSSock::Socket_*,_std::hash<AGSSock::Socket_*>,_std::equal_to<AGSSock::Socket_*>,_std::allocator<AGSSock::Socket_*>_>
  ::clear(&this->sockets_);
  AGSSockAPI::Beacon::signal(&this->beacon_,__sig,__handler);
  AGSSockAPI::Mutex::Lock::~Lock(&local_18);
  return;
}

Assistant:

void Pool::clear()
{
	Mutex::Lock lock(guard_);

	sockets_.clear();
	beacon_.signal();
}